

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Add
          (PersistentStorageJson *this,Domain *aValue,DomainId *aRetId)

{
  Status SVar1;
  string local_60;
  string local_40;
  DomainId *local_20;
  DomainId *aRetId_local;
  Domain *aValue_local;
  PersistentStorageJson *this_local;
  
  local_20 = aRetId;
  aRetId_local = &aValue->mId;
  aValue_local = (Domain *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)JSON_DOM_SEQ_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_60,(string *)JSON_DOM_abi_cxx11_);
  SVar1 = AddOne<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>
                    (this,aValue,aRetId,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Add(Domain const &aValue, DomainId &aRetId)
{
    return AddOne<Domain, DomainId>(aValue, aRetId, JSON_DOM_SEQ, JSON_DOM);
}